

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_set_filenames(nifti_image *nim,char *prefix,int check,int set_byte_order)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = nifti_is_gzfile(prefix);
  if ((nim == (nifti_image *)0x0) || (prefix == (char *)0x0)) {
    fprintf(_stderr,"** nifti_set_filenames, bad params %p, %p\n",nim,prefix);
  }
  else {
    if (1 < g_opts_0) {
      fprintf(_stderr,"+d modifying output filenames using prefix %s\n",prefix);
    }
    if (nim->fname != (char *)0x0) {
      free(nim->fname);
    }
    if (nim->iname != (char *)0x0) {
      free(nim->iname);
    }
    pcVar2 = nifti_makehdrname(prefix,nim->nifti_type,check,iVar1);
    nim->fname = pcVar2;
    pcVar2 = nifti_makeimgname(prefix,nim->nifti_type,check,iVar1);
    nim->iname = pcVar2;
    if ((pcVar2 == (char *)0x0) || (nim->fname == (char *)0x0)) {
      fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n","nifti_set_filename","failed to set prefix for",
              prefix);
    }
    else {
      if (set_byte_order != 0) {
        nim->byteorder = 1;
      }
      iVar1 = nifti_set_type_from_names(nim);
      if (-1 < iVar1) {
        if (g_opts_0 < 3) {
          return 0;
        }
        fprintf(_stderr,"+d have new filenames %s and %s\n",nim->fname,nim->iname);
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int nifti_set_filenames( nifti_image * nim, const char * prefix, int check,
                         int set_byte_order )
{
   int comp = nifti_is_gzfile(prefix);

   if( !nim || !prefix ){
      fprintf(stderr,"** nifti_set_filenames, bad params %p, %p\n",
              (void *)nim,prefix);
      return -1;
   }

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d modifying output filenames using prefix %s\n", prefix);

   if( nim->fname ) free(nim->fname);
   if( nim->iname ) free(nim->iname);
   nim->fname = nifti_makehdrname(prefix, nim->nifti_type, check, comp);
   nim->iname = nifti_makeimgname(prefix, nim->nifti_type, check, comp);
   if( !nim->fname || !nim->iname ){
      LNI_FERR("nifti_set_filename","failed to set prefix for",prefix);
      return -1;
   }

   if( set_byte_order ) nim->byteorder = nifti_short_order() ;

   if( nifti_set_type_from_names(nim) < 0 )
      return -1;

   if( g_opts.debug > 2 )
      fprintf(stderr,"+d have new filenames %s and %s\n",nim->fname,nim->iname);

   return 0;
}